

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageFieldGenerator::GenerateInternalAccessorDeclarations
          (MessageFieldGenerator *this,Printer *printer)

{
  undefined1 local_50 [8];
  Formatter format;
  Printer *printer_local;
  MessageFieldGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  Formatter::Formatter((Formatter *)local_50,printer,&(this->super_FieldGenerator).variables_);
  if ((this->implicit_weak_field_ & 1U) == 0) {
    Formatter::operator()<>
              ((Formatter *)local_50,"static const $type$& $name$(const $classname$* msg);\n");
  }
  else {
    Formatter::operator()<>
              ((Formatter *)local_50,
               "static const ::$proto_ns$::MessageLite& $name$(const $classname$* msg);\nstatic ::$proto_ns$::MessageLite* mutable_$name$($classname$* msg);\n"
              );
  }
  Formatter::~Formatter((Formatter *)local_50);
  return;
}

Assistant:

void MessageFieldGenerator::GenerateInternalAccessorDeclarations(
    io::Printer* printer) const {
  Formatter format(printer, variables_);
  if (implicit_weak_field_) {
    format(
        "static const ::$proto_ns$::MessageLite& $name$("
        "const $classname$* msg);\n"
        "static ::$proto_ns$::MessageLite* mutable_$name$("
        "$classname$* msg);\n");
  } else {
    format("static const $type$& $name$(const $classname$* msg);\n");
  }
}